

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O1

void __thiscall TPZTensor<double>::CopyToTensor(TPZTensor<double> *this,TPZFMatrix<double> *Tensor)

{
  double dVar1;
  long lVar2;
  
  (*(Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xd])
            (Tensor,3,3);
  if (((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  *Tensor->fElem = *(this->fData).super_TPZVec<double>.fStore;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[1];
  if (((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 2) ||
     ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Tensor->fElem[1] = dVar1;
  if (((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  Tensor->fElem[lVar2] = dVar1;
  dVar1 = (this->fData).super_TPZVec<double>.fStore[2];
  if ((lVar2 < 3) || ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  Tensor->fElem[2] = dVar1;
  if (((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow < 1) ||
     ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 3)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  Tensor->fElem[lVar2 * 2] = dVar1;
  if ((lVar2 < 2) || ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  Tensor->fElem[lVar2 + 1] = (this->fData).super_TPZVec<double>.fStore[3];
  dVar1 = (this->fData).super_TPZVec<double>.fStore[4];
  if ((lVar2 < 3) || ((Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  lVar2 = (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
  Tensor->fElem[lVar2 + 2] = dVar1;
  if ((1 < lVar2) && (2 < (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
    lVar2 = (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    Tensor->fElem[lVar2 * 2 + 1] = dVar1;
    if ((2 < lVar2) && (2 < (Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol)) {
      Tensor->fElem[(Tensor->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * 2 + 2] =
           (this->fData).super_TPZVec<double>.fStore[5];
      return;
    }
    TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

void TPZTensor<T>::CopyToTensor(TPZFMatrix<T> & Tensor) const {
    Tensor.Resize(3, 3);
    Tensor(0, 0) = XX();
    Tensor(0, 1) = Tensor(1, 0) = XY();
    Tensor(0, 2) = Tensor(2, 0) = XZ();
    Tensor(1, 1) = YY();
    Tensor(1, 2) = Tensor(2, 1) = YZ();
    Tensor(2, 2) = ZZ();
}